

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem1.cpp
# Opt level: O0

bool binSearch(int *arr,int size,int key)

{
  bool bVar1;
  int local_18;
  int local_14;
  int key_local;
  int size_local;
  int *arr_local;
  
  local_18 = key;
  local_14 = size;
  _key_local = arr;
  std::sort<int*>(arr,arr + size);
  bVar1 = std::binary_search<int*,int>(_key_local,_key_local + local_14,&local_18);
  return bVar1;
}

Assistant:

bool binSearch(int arr[],int size,int key){ sort(arr, arr+size); return binary_search(arr, arr+size, key); }